

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O2

int main(int argc,char **argv)

{
  size_type sVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  ostream *poVar6;
  uint uVar7;
  ifstream *this;
  char *pcVar8;
  char *pcVar9;
  long lVar10;
  char **ppcVar11;
  bool bVar12;
  allocator local_471;
  int num_column;
  WarningType local_46c;
  string input_data_type;
  string local_438;
  DataTransformWrapper data_transform;
  string output_data_type;
  string data_types;
  string print_format;
  string str;
  ifstream ifs;
  byte abStack_218 [488];
  
  num_column = 1;
  std::__cxx11::string::string((string *)&print_format,"",(allocator *)&ifs);
  std::__cxx11::string::string((string *)&data_types,"da",(allocator *)&ifs);
  bVar12 = false;
  local_46c = kExit;
LAB_00109612:
  iVar5 = ya_getopt_long(argc,argv,"re:c:f:h",(option *)0x0,(int *)0x0);
  uVar7 = 1;
  switch(iVar5) {
  case 99:
    std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&str);
    bVar2 = sptk::ConvertStringToInteger((string *)&ifs,&num_column);
    bVar3 = num_column < 1;
    std::__cxx11::string::~string((string *)&ifs);
    if (!bVar2 || bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      std::operator<<((ostream *)&ifs,"The argument for the -c option must be a positive integer");
      std::__cxx11::string::string((string *)&str,"x2x",(allocator *)&input_data_type);
      sptk::PrintErrorMessage(&str,(ostringstream *)&ifs);
      goto LAB_0010981b;
    }
    goto LAB_00109612;
  case 100:
  case 0x67:
    goto switchD_00109642_caseD_64;
  case 0x65:
    std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&str);
    bVar3 = sptk::ConvertStringToInteger((string *)&ifs,(int *)&input_data_type);
    if (bVar3) {
      bVar3 = sptk::IsInRange((WarningType)input_data_type._M_dataplus._M_p,0,2);
      std::__cxx11::string::~string((string *)&ifs);
      if (bVar3) {
        local_46c = (WarningType)input_data_type._M_dataplus._M_p;
        goto LAB_00109612;
      }
    }
    else {
      std::__cxx11::string::~string((string *)&ifs);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    poVar6 = std::operator<<((ostream *)&ifs,"The argument for the -e option must be an integer ");
    poVar6 = std::operator<<(poVar6,"in the range of ");
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0);
    poVar6 = std::operator<<(poVar6," to ");
    std::ostream::operator<<((ostream *)poVar6,2);
    std::__cxx11::string::string((string *)&str,"x2x",(allocator *)&output_data_type);
    sptk::PrintErrorMessage(&str,(ostringstream *)&ifs);
    goto LAB_0010981b;
  case 0x66:
    goto switchD_00109642_caseD_66;
  case 0x68:
    uVar7 = 0;
    anon_unknown.dwarf_2019::PrintUsage((ostream *)&std::cout);
    goto LAB_00109835;
  default:
    if (iVar5 == -1) {
      lVar10 = (long)(argc - ya_optind);
      ppcVar11 = argv + (argc - lVar10);
      uVar7 = 0;
      pcVar8 = (char *)0x0;
      break;
    }
    if (iVar5 == 0x72) {
      bVar12 = true;
      goto LAB_00109612;
    }
switchD_00109642_caseD_64:
    anon_unknown.dwarf_2019::PrintUsage((ostream *)&std::cerr);
    goto LAB_00109835;
  }
LAB_00109891:
  if (lVar10 < 1) goto LAB_00109979;
  pcVar9 = *ppcVar11;
  if (*pcVar9 == '+') {
    std::__cxx11::string::string((string *)&str,pcVar9,(allocator *)&ifs);
    std::__cxx11::string::substr((ulong)&ifs,(ulong)&str);
    std::__cxx11::string::operator=((string *)&data_types,(string *)&ifs);
    std::__cxx11::string::~string((string *)&ifs);
    sVar1 = data_types._M_string_length;
    if (data_types._M_string_length != 2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      std::operator<<((ostream *)&ifs,"The +type option must be two characters");
      std::__cxx11::string::string((string *)&input_data_type,"x2x",(allocator *)&output_data_type);
      sptk::PrintErrorMessage(&input_data_type,(ostringstream *)&ifs);
      std::__cxx11::string::~string((string *)&input_data_type);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
      uVar7 = 1;
    }
    std::__cxx11::string::~string((string *)&str);
    pcVar9 = pcVar8;
    if (sVar1 != 2) goto LAB_00109835;
  }
  else if (pcVar8 != (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    std::operator<<((ostream *)&ifs,"Too many input files");
    std::__cxx11::string::string((string *)&str,"x2x",(allocator *)&input_data_type);
    sptk::PrintErrorMessage(&str,(ostringstream *)&ifs);
    goto LAB_00109adf;
  }
  lVar10 = lVar10 + -1;
  ppcVar11 = ppcVar11 + 1;
  pcVar8 = pcVar9;
  goto LAB_00109891;
switchD_00109642_caseD_66:
  std::__cxx11::string::assign((char *)&print_format);
  std::__cxx11::string::substr((ulong)&ifs,(ulong)&print_format);
  bVar3 = std::operator!=("%",(string *)&ifs);
  std::__cxx11::string::~string((string *)&ifs);
  if (bVar3) goto LAB_001097cc;
  goto LAB_00109612;
LAB_001097cc:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
  std::operator<<((ostream *)&ifs,"The argument for the -f option must be begin with %");
  std::__cxx11::string::string((string *)&str,"x2x",(allocator *)&input_data_type);
  sptk::PrintErrorMessage(&str,(ostringstream *)&ifs);
LAB_0010981b:
  uVar7 = 1;
  std::__cxx11::string::~string((string *)&str);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
  goto LAB_00109835;
LAB_00109979:
  bVar3 = sptk::SetBinaryMode();
  if (bVar3) {
    this = &ifs;
    std::ifstream::ifstream(this);
    if ((pcVar8 == (char *)0x0) ||
       (std::ifstream::open((char *)&ifs,(_Ios_Openmode)pcVar8),
       (abStack_218[*(long *)(_ifs + -0x18)] & 5) == 0)) {
      cVar4 = std::__basic_file<char>::is_open();
      if (cVar4 == '\0') {
        this = (ifstream *)&std::cin;
      }
      std::__cxx11::string::substr((ulong)&input_data_type,(ulong)&data_types);
      std::__cxx11::string::substr((ulong)&output_data_type,(ulong)&data_types);
      anon_unknown.dwarf_2019::DataTransformWrapper::DataTransformWrapper
                (&data_transform,&input_data_type,&output_data_type,&print_format,num_column,
                 local_46c,bVar12);
      if (data_transform.data_transform_ == (DataTransformInterface *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
        std::operator<<((ostream *)&str,"Unexpected argument for the +type option");
        std::__cxx11::string::string((string *)&local_438,"x2x",&local_471);
        sptk::PrintErrorMessage(&local_438,(ostringstream *)&str);
        std::__cxx11::string::~string((string *)&local_438);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
        uVar7 = 1;
      }
      else {
        iVar5 = (*(data_transform.data_transform_)->_vptr_DataTransformInterface[2])
                          (data_transform.data_transform_,this);
        bVar12 = (char)iVar5 == '\0';
        if (bVar12) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
          std::operator<<((ostream *)&str,"Failed to transform");
          std::__cxx11::string::string((string *)&local_438,"x2x",&local_471);
          sptk::PrintErrorMessage(&local_438,(ostringstream *)&str);
          std::__cxx11::string::~string((string *)&local_438);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
        }
        uVar7 = (uint)bVar12;
        (*(data_transform.data_transform_)->_vptr_DataTransformInterface[1])
                  (data_transform.data_transform_);
      }
      std::__cxx11::string::~string((string *)&output_data_type);
      std::__cxx11::string::~string((string *)&input_data_type);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
      poVar6 = std::operator<<((ostream *)&str,"Cannot open file ");
      std::operator<<(poVar6,pcVar8);
      std::__cxx11::string::string((string *)&input_data_type,"x2x",(allocator *)&output_data_type);
      sptk::PrintErrorMessage(&input_data_type,(ostringstream *)&str);
      std::__cxx11::string::~string((string *)&input_data_type);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
      uVar7 = 1;
    }
    std::ifstream::~ifstream(&ifs);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    std::operator<<((ostream *)&ifs,"Cannot set translation mode");
    std::__cxx11::string::string((string *)&str,"x2x",(allocator *)&input_data_type);
    sptk::PrintErrorMessage(&str,(ostringstream *)&ifs);
LAB_00109adf:
    std::__cxx11::string::~string((string *)&str);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
    uVar7 = 1;
  }
LAB_00109835:
  std::__cxx11::string::~string((string *)&data_types);
  std::__cxx11::string::~string((string *)&print_format);
  return uVar7;
}

Assistant:

int main(int argc, char* argv[]) {
  bool rounding_flag(kDefaultRoundingFlag);
  WarningType warning_type(kDefaultWarningType);
  int num_column(kDefaultNumColumn);
  std::string print_format("");
  std::string data_types(kDefaultDataTypes);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "re:c:f:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'r': {
        rounding_flag = true;
        break;
      }
      case 'e': {
        const int min(0);
        const int max(static_cast<int>(kNumWarningTypes) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -e option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("x2x", error_message);
          return 1;
        }
        warning_type = static_cast<WarningType>(tmp);
        break;
      }
      case 'c': {
        if (!sptk::ConvertStringToInteger(optarg, &num_column) ||
            num_column <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -c option must be a positive integer";
          sptk::PrintErrorMessage("x2x", error_message);
          return 1;
        }
        break;
      }
      case 'f': {
        print_format = optarg;
        if ("%" != print_format.substr(0, 1)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -f option must be begin with %";
          sptk::PrintErrorMessage("x2x", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const char* input_file(NULL);
  for (int i(argc - optind); 1 <= i; --i) {
    const char* arg(argv[argc - i]);
    if (0 == std::strncmp(arg, "+", 1)) {
      const std::string str(arg);
      data_types = str.substr(1, std::string::npos);
      if (2 != data_types.size()) {
        std::ostringstream error_message;
        error_message << "The +type option must be two characters";
        sptk::PrintErrorMessage("x2x", error_message);
        return 1;
      }
    } else if (NULL == input_file) {
      input_file = arg;
    } else {
      std::ostringstream error_message;
      error_message << "Too many input files";
      sptk::PrintErrorMessage("x2x", error_message);
      return 1;
    }
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("x2x", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("x2x", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  const std::string input_data_type(data_types.substr(0, 1));
  const std::string output_data_type(data_types.substr(1, 1));
  DataTransformWrapper data_transform(input_data_type, output_data_type,
                                      print_format, num_column, warning_type,
                                      rounding_flag);

  if (!data_transform.IsValid()) {
    std::ostringstream error_message;
    error_message << "Unexpected argument for the +type option";
    sptk::PrintErrorMessage("x2x", error_message);
    return 1;
  }

  if (!data_transform.Run(&input_stream)) {
    std::ostringstream error_message;
    error_message << "Failed to transform";
    sptk::PrintErrorMessage("x2x", error_message);
    return 1;
  }

  return 0;
}